

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O1

int main(void)

{
  GLFWcursor *cursorHandle;
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLFWcursor *pGVar7;
  GLFWwindow *handle;
  long lVar8;
  GLFWcursor **ppGVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int fb_height;
  int fb_width;
  vec2 vertices [4];
  int wnd_width;
  int wnd_height;
  GLuint vertex_buffer;
  GLFWcursor *star_cursors [60];
  uchar buffer [16384];
  GLsizei local_4290;
  GLsizei local_428c;
  undefined1 local_4288 [8];
  undefined8 local_4280;
  float local_4278;
  undefined4 local_4274;
  float local_4270;
  float local_426c;
  float local_4264;
  float local_4260;
  int local_425c;
  double local_4258;
  int local_4250;
  GLuint local_424c;
  undefined1 local_4248 [16];
  undefined1 local_4238 [16];
  undefined1 local_4228 [16];
  undefined8 auStack_4218 [60];
  undefined4 local_4038;
  undefined8 local_4034;
  undefined8 uStack_402c;
  float local_4024;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 local_4010;
  float local_4008;
  float local_4004;
  undefined8 local_4000;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    lVar12 = 0;
    do {
      local_4288 = (undefined1  [8])0x4000000040;
      local_4280 = (uchar *)&local_4038;
      local_4258 = (double)((float)(int)lVar12 / 60.0) * 6.283185307179586;
      iVar2 = 0;
      iVar10 = 0;
      do {
        if (0 < (int)local_4288._4_4_) {
          fVar13 = (float)iVar2 + -32.0;
          local_4228 = ZEXT416((uint)(fVar13 * fVar13));
          local_4248 = ZEXT416((uint)ABS(fVar13));
          lVar11 = (long)iVar10;
          lVar8 = 0;
          do {
            *(undefined2 *)((long)&local_4038 + lVar8 * 4 + lVar11) = 0xffff;
            *(undefined1 *)((long)&local_4038 + lVar8 * 4 + lVar11 + 2) = 0xff;
            dVar1 = sin(local_4258);
            fVar16 = (float)dVar1 * 0.25 + 0.75;
            fVar13 = (float)(int)lVar8 + -32.0;
            fVar14 = fVar13 * fVar13 + (float)local_4228._0_4_;
            if (fVar14 < 0.0) {
              local_4238 = ZEXT416((uint)fVar13);
              local_4264 = fVar16 * 3.0;
              local_4260 = fVar16;
              fVar14 = sqrtf(fVar14);
              fVar13 = (float)local_4238._0_4_;
              fVar17 = local_4264;
              fVar16 = local_4260;
            }
            else {
              fVar14 = SQRT(fVar14);
              fVar17 = fVar16 * 3.0;
            }
            fVar15 = 32.0;
            if ((int)lVar8 != 0x20) {
              fVar15 = fVar17 / ABS(fVar13);
            }
            fVar13 = 32.0;
            if (iVar2 != 0x20) {
              fVar13 = fVar17 / (float)local_4248._0_4_;
            }
            fVar14 = fVar14 * -0.03125 + 1.0;
            dVar1 = (double)(fVar16 * fVar14 * 0.2 + fVar14 * fVar15 * fVar13);
            if (1.0 <= dVar1) {
              dVar1 = 1.0;
            }
            if (dVar1 <= 0.0) {
              dVar1 = 0.0;
            }
            *(char *)((long)&local_4038 + lVar8 * 4 + lVar11 + 3) =
                 (char)(int)((float)dVar1 * 255.0);
            iVar10 = iVar10 + 4;
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 < (int)local_4288._4_4_);
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < (int)local_4288._0_4_);
      pGVar7 = glfwCreateCursor((GLFWimage *)local_4288,(int)local_4288._0_4_ / 2,
                                (int)local_4288._4_4_ / 2);
      auStack_4218[lVar12] = pGVar7;
      if (pGVar7 == (GLFWcursor *)0x0) goto LAB_00110df4;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x3c);
    ppGVar9 = standard_cursors;
    lVar12 = 0;
    do {
      pGVar7 = glfwCreateStandardCursor(*(int *)((long)&DAT_001210f0 + lVar12));
      *ppGVar9 = pGVar7;
      if (pGVar7 == (GLFWcursor *)0x0) goto LAB_00110df4;
      lVar12 = lVar12 + 4;
      ppGVar9 = ppGVar9 + 1;
    } while (lVar12 != 0x18);
    glfwWindowHint(0x22002,2);
    glfwWindowHint(0x22003,0);
    handle = glfwCreateWindow(0x280,0x1e0,"Cursor Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      (*glad_glGenBuffers)(1,&local_424c);
      (*glad_glBindBuffer)(0x8892,local_424c);
      GVar3 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar3);
      GVar4 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar4);
      GVar5 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar5,GVar3);
      (*glad_glAttachShader)(GVar5,GVar4);
      (*glad_glLinkProgram)(GVar5);
      GVar6 = (*glad_glGetUniformLocation)(GVar5,"MVP");
      GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
      (*glad_glEnableVertexAttribArray)(GVar3);
      (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
      (*glad_glUseProgram)(GVar5);
      glfwGetCursorPos(handle,&cursor_x,&cursor_y);
      printf("Cursor position: %f %f\n",SUB84(cursor_x,0),SUB84(cursor_y,0));
      glfwSetCursorPosCallback(handle,cursor_position_callback);
      glfwSetKeyCallback(handle,key_callback);
      iVar2 = glfwWindowShouldClose(handle);
      if (iVar2 == 0) {
        pGVar7 = (GLFWcursor *)0x0;
        do {
          (*glad_glClear)(0x4000);
          if (track_cursor != 0) {
            glfwGetWindowSize(handle,&local_425c,&local_4250);
            glfwGetFramebufferSize(handle,&local_428c,&local_4290);
            (*glad_glViewport)(0,0,local_428c,local_4290);
            dVar1 = (double)((float)local_428c / (float)local_425c);
            fVar13 = (float)((double)local_4290 - cursor_y * dVar1);
            local_4288 = (undefined1  [8])((ulong)(uint)fVar13 << 0x20);
            local_4278 = (float)(dVar1 * cursor_x);
            local_4280 = (uchar *)CONCAT44(fVar13,(float)local_428c);
            local_4274 = 0;
            local_426c = (float)local_4290;
            local_4270 = local_4278;
            (*glad_glBufferData)(0x8892,0x20,local_4288,0x88e0);
            local_4008 = (float)local_428c;
            local_4004 = (float)local_4290;
            local_4038 = 2.0 / local_4008;
            local_4034 = 0;
            uStack_402c = 0;
            local_4024 = 2.0 / local_4004;
            local_4020 = 0;
            uStack_4018 = 0;
            local_4010 = 0xc0000000;
            local_4008 = -local_4008 / local_4008;
            local_4004 = -local_4004 / local_4004;
            local_4000 = 0x3f800000bf800000;
            (*glad_glUniformMatrix4fv)(GVar6,1,'\0',(GLfloat *)&local_4038);
            (*glad_glDrawArrays)(1,0,4);
          }
          glfwSwapBuffers(handle);
          if (animate_cursor == 0) {
            pGVar7 = (GLFWcursor *)0x0;
          }
          else {
            dVar1 = glfwGetTime();
            cursorHandle = (GLFWcursor *)auStack_4218[(int)(dVar1 * 30.0) % 0x3c];
            if (pGVar7 != cursorHandle) {
              glfwSetCursor(handle,cursorHandle);
              pGVar7 = cursorHandle;
            }
          }
          if (wait_events == 0) {
            glfwPollEvents();
          }
          else if (animate_cursor == 0) {
            glfwWaitEvents();
          }
          else {
            glfwWaitEventsTimeout(0.03333333333333333);
          }
          fflush(_stdout);
          iVar2 = glfwWindowShouldClose(handle);
        } while (iVar2 == 0);
      }
      glfwDestroyWindow(handle);
      lVar12 = 0;
      do {
        glfwDestroyCursor((GLFWcursor *)auStack_4218[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x3c);
      lVar12 = 0;
      do {
        glfwDestroyCursor(*(GLFWcursor **)((long)standard_cursors + lVar12));
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x30);
      glfwTerminate();
      exit(0);
    }
LAB_00110df4:
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLFWwindow* window;
    GLFWcursor* star_cursors[CURSOR_FRAME_COUNT];
    GLFWcursor* current_frame = NULL;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
    {
        star_cursors[i] = create_cursor_frame(i / (float) CURSOR_FRAME_COUNT);
        if (!star_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
    {
        const int shapes[] = {
            GLFW_ARROW_CURSOR,
            GLFW_IBEAM_CURSOR,
            GLFW_CROSSHAIR_CURSOR,
            GLFW_HAND_CURSOR,
            GLFW_HRESIZE_CURSOR,
            GLFW_VRESIZE_CURSOR
        };

        standard_cursors[i] = glfwCreateStandardCursor(shapes[i]);
        if (!standard_cursors[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(640, 480, "Cursor Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vec2), (void*) 0);
    glUseProgram(program);

    glfwGetCursorPos(window, &cursor_x, &cursor_y);
    printf("Cursor position: %f %f\n", cursor_x, cursor_y);

    glfwSetCursorPosCallback(window, cursor_position_callback);
    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        if (track_cursor)
        {
            int wnd_width, wnd_height, fb_width, fb_height;
            float scale;
            vec2 vertices[4];
            mat4x4 mvp;

            glfwGetWindowSize(window, &wnd_width, &wnd_height);
            glfwGetFramebufferSize(window, &fb_width, &fb_height);

            glViewport(0, 0, fb_width, fb_height);

            scale = (float) fb_width / (float) wnd_width;
            vertices[0][0] = 0.f;
            vertices[0][1] = (float) (fb_height - cursor_y * scale);
            vertices[1][0] = (float) fb_width;
            vertices[1][1] = (float) (fb_height - cursor_y * scale);
            vertices[2][0] = (float) (cursor_x * scale);
            vertices[2][1] = 0.f;
            vertices[3][0] = (float) (cursor_x * scale);
            vertices[3][1] = (float) fb_height;

            glBufferData(GL_ARRAY_BUFFER,
                         sizeof(vertices),
                         vertices,
                         GL_STREAM_DRAW);

            mat4x4_ortho(mvp, 0.f, (float) fb_width, 0.f, (float) fb_height, 0.f, 1.f);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);

            glDrawArrays(GL_LINES, 0, 4);
        }

        glfwSwapBuffers(window);

        if (animate_cursor)
        {
            const int i = (int) (glfwGetTime() * 30.0) % CURSOR_FRAME_COUNT;
            if (current_frame != star_cursors[i])
            {
                glfwSetCursor(window, star_cursors[i]);
                current_frame = star_cursors[i];
            }
        }
        else
            current_frame = NULL;

        if (wait_events)
        {
            if (animate_cursor)
                glfwWaitEventsTimeout(1.0 / 30.0);
            else
                glfwWaitEvents();
        }
        else
            glfwPollEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwDestroyWindow(window);

    for (i = 0;  i < CURSOR_FRAME_COUNT;  i++)
        glfwDestroyCursor(star_cursors[i]);

    for (i = 0;  i < sizeof(standard_cursors) / sizeof(standard_cursors[0]);  i++)
        glfwDestroyCursor(standard_cursors[i]);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}